

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_linux.c
# Opt level: O2

STRING_HANDLE platform_get_platform_info(PLATFORM_INFO_OPTION options)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  STRING_HANDLE pSVar3;
  utsname nnn;
  
  iVar1 = uname((utsname *)&nnn);
  if (iVar1 != 0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_INFO,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/platform_linux.c"
                ,"platform_get_platform_info",0x5a,1,"WARNING: failed to find machine info.");
    }
    pSVar3 = STRING_construct("(native; Linux; undefined)");
    return pSVar3;
  }
  pSVar3 = STRING_construct_sprintf("(native; %s; %s)",&nnn,nnn.machine);
  return pSVar3;
}

Assistant:

STRING_HANDLE platform_get_platform_info(PLATFORM_INFO_OPTION options)
{
    // No applicable options, so ignoring parameter
    (void)options;

    // Expected format: "(<runtime name>; <operating system name>; <platform>)"

    STRING_HANDLE result;
    struct utsname nnn;

    if (uname(&nnn) == 0)
    {
        result = STRING_construct_sprintf("(native; %s; %s)", nnn.sysname, nnn.machine);
    }
    else
    {
        LogInfo("WARNING: failed to find machine info.");
        result = STRING_construct("(native; Linux; undefined)");
    }
    return result;
}